

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O1

qint64 QBenchmarkValgrindUtils::extractLastResult(void)

{
  qint64 qVar1;
  long in_FS_OFFSET;
  QString local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  getNewestFileName();
  qVar1 = extractResult(&local_28);
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QBenchmarkValgrindUtils::extractLastResult()
{
    return extractResult(getNewestFileName());
}